

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O1

VP8LRefsCursor * VP8LRefsCursorInit(VP8LRefsCursor *__return_storage_ptr__,VP8LBackwardRefs *refs)

{
  PixOrCopyBlock *pPVar1;
  PixOrCopy *pPVar2;
  
  pPVar1 = refs->refs;
  __return_storage_ptr__->cur_block = pPVar1;
  if (pPVar1 == (PixOrCopyBlock *)0x0) {
    __return_storage_ptr__->cur_pos = (PixOrCopy *)0x0;
    pPVar2 = (PixOrCopy *)0x0;
  }
  else {
    pPVar2 = pPVar1->start;
    __return_storage_ptr__->cur_pos = pPVar2;
    pPVar2 = pPVar2 + pPVar1->size;
  }
  __return_storage_ptr__->last_pos = pPVar2;
  return __return_storage_ptr__;
}

Assistant:

VP8LRefsCursor VP8LRefsCursorInit(const VP8LBackwardRefs* const refs) {
  VP8LRefsCursor c;
  c.cur_block = refs->refs;
  if (refs->refs != NULL) {
    c.cur_pos = c.cur_block->start;
    c.last_pos = c.cur_pos + c.cur_block->size;
  } else {
    c.cur_pos = NULL;
    c.last_pos = NULL;
  }
  return c;
}